

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

void __thiscall argparse::ArgumentParser::ArgumentParser(ArgumentParser *this,string *aProgramName)

{
  _Rb_tree_header *p_Var1;
  Argument *pAVar2;
  allocator<char> local_41;
  string local_40 [32];
  
  std::__cxx11::string::string((string *)this,(string *)aProgramName);
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mPositionalArguments;
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mPositionalArguments;
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mOptionalArguments;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mOptionalArguments;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  p_Var1 = &(this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pAVar2 = add_argument<char_const*,char_const*>(this,"-h","--help");
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"show this help message and exit",&local_41);
  std::__cxx11::string::operator=((string *)&pAVar2->mHelp,local_40);
  pAVar2->mNumArgs = 0;
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

explicit ArgumentParser(std::string aProgramName = {})
      : mProgramName(std::move(aProgramName)) {
    add_argument("-h", "--help")
        .help("show this help message and exit")
        .nargs(0);
  }